

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

int ap_to_rw_prot(CPUARMState_conflict *env,ARMMMUIdx mmu_idx,int ap,int domain_prot)

{
  _Bool _Var1;
  uint uVar2;
  int iVar3;
  uint64_t uVar4;
  _Bool is_user;
  int domain_prot_local;
  int ap_local;
  ARMMMUIdx mmu_idx_local;
  CPUARMState_conflict *env_local;
  
  _Var1 = regime_is_user(env,mmu_idx);
  if (domain_prot == 3) {
    env_local._4_4_ = 3;
  }
  else {
    switch(ap) {
    case 0:
      iVar3 = arm_feature(env,5);
      if (iVar3 == 0) {
        uVar4 = regime_sctlr(env,mmu_idx);
        uVar2 = (uint)uVar4 & 0x300;
        if (uVar2 == 0x100) {
          env_local._4_4_ = (uint)!_Var1;
        }
        else if (uVar2 == 0x200) {
          env_local._4_4_ = 1;
        }
        else {
          env_local._4_4_ = 0;
        }
      }
      else {
        env_local._4_4_ = 0;
      }
      break;
    case 1:
      env_local._4_4_ = 3;
      if (_Var1) {
        env_local._4_4_ = 0;
      }
      break;
    case 2:
      if (_Var1) {
        env_local._4_4_ = 1;
      }
      else {
        env_local._4_4_ = 3;
      }
      break;
    case 3:
      env_local._4_4_ = 3;
      break;
    case 4:
      env_local._4_4_ = 0;
      break;
    case 5:
      env_local._4_4_ = (uint)!_Var1;
      break;
    case 6:
      env_local._4_4_ = 1;
      break;
    case 7:
      iVar3 = arm_feature(env,4);
      if (iVar3 == 0) {
        env_local._4_4_ = 0;
      }
      else {
        env_local._4_4_ = 1;
      }
      break;
    default:
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/helper.c"
                 ,0x23c0,(char *)0x0);
    }
  }
  return env_local._4_4_;
}

Assistant:

static inline int ap_to_rw_prot(CPUARMState *env, ARMMMUIdx mmu_idx,
                                int ap, int domain_prot)
{
    bool is_user = regime_is_user(env, mmu_idx);

    if (domain_prot == 3) {
        return PAGE_READ | PAGE_WRITE;
    }

    switch (ap) {
    case 0:
        if (arm_feature(env, ARM_FEATURE_V7)) {
            return 0;
        }
        switch (regime_sctlr(env, mmu_idx) & (SCTLR_S | SCTLR_R)) {
        case SCTLR_S:
            return is_user ? 0 : PAGE_READ;
        case SCTLR_R:
            return PAGE_READ;
        default:
            return 0;
        }
    case 1:
        return is_user ? 0 : PAGE_READ | PAGE_WRITE;
    case 2:
        if (is_user) {
            return PAGE_READ;
        } else {
            return PAGE_READ | PAGE_WRITE;
        }
    case 3:
        return PAGE_READ | PAGE_WRITE;
    case 4: /* Reserved.  */
        return 0;
    case 5:
        return is_user ? 0 : PAGE_READ;
    case 6:
        return PAGE_READ;
    case 7:
        if (!arm_feature(env, ARM_FEATURE_V6K)) {
            return 0;
        }
        return PAGE_READ;
    default:
        g_assert_not_reached();
        // never reach here
        return PAGE_READ;
    }
}